

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall QDateTimeEdit::QDateTimeEdit(QDateTimeEdit *this,QWidget *parent)

{
  QTimeZone *this_00;
  QDateTimeEditPrivate *this_01;
  QDateTimeEditPrivate *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QDateTimeEditPrivate *d;
  Initialization in_stack_ffffffffffffff6c;
  QAbstractSpinBoxPrivate *in_stack_ffffffffffffff88;
  QAbstractSpinBox *in_stack_ffffffffffffff90;
  QTimeZone *in_stack_ffffffffffffffa8;
  QDate local_40;
  QDateTime local_38 [8];
  QTimeZone local_30;
  EVP_PKEY_CTX local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QTimeZone *)operator_new(0x510);
  QTimeZone::QTimeZone(this_00,in_stack_ffffffffffffff6c);
  QDateTimeEditPrivate::QDateTimeEditPrivate(in_RSI,in_stack_ffffffffffffffa8);
  QAbstractSpinBox::QAbstractSpinBox(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_RDI);
  QTimeZone::~QTimeZone(&local_30);
  *(undefined ***)in_RDI = &PTR_metaObject_00d11c88;
  *(undefined ***)&in_RDI->super_QPaintDevice = &PTR__QDateTimeEdit_00d11e78;
  this_01 = d_func((QDateTimeEdit *)0x557632);
  QDate::QDate(&local_40,2000,1,1);
  QDate::startOfDay();
  ::QVariant::QVariant((QVariant *)local_28,local_38);
  QDateTimeEditPrivate::init(this_01,local_28);
  ::QVariant::~QVariant((QVariant *)local_28);
  QDateTime::~QDateTime(local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDateTimeEdit::QDateTimeEdit(QWidget *parent)
    : QAbstractSpinBox(*new QDateTimeEditPrivate, parent)
{
    Q_D(QDateTimeEdit);
    d->init(QDATETIMEEDIT_DATE_INITIAL.startOfDay());
}